

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O2

int CfdGetConfidentialTxInfo
              (void *handle,char *tx_hex_string,char **txid,char **wtxid,char **wit_hash,
              uint32_t *size,uint32_t *vsize,uint32_t *weight,uint32_t *version,uint32_t *locktime)

{
  bool bVar1;
  uint32_t uVar2;
  ConfidentialTransaction *this;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  CfdException *this_00;
  string sStack_108;
  void *local_e8;
  Txid local_e0;
  char **local_c0;
  char **local_b8;
  char *work_wit_hash;
  char *work_wtxid;
  char *work_txid;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_98;
  ConfidentialTransactionController ctxc;
  
  work_txid = (char *)0x0;
  work_wtxid = (char *)0x0;
  work_wit_hash = (char *)0x0;
  local_e8 = handle;
  local_c0 = wit_hash;
  local_b8 = wtxid;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(tx_hex_string);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&sStack_108,tx_hex_string,(allocator *)&local_e0);
    cfd::ConfidentialTransactionController::ConfidentialTransactionController(&ctxc,&sStack_108);
    std::__cxx11::string::~string((string *)&sStack_108);
    this = cfd::ConfidentialTransactionController::GetTransaction(&ctxc);
    if (txid == (char **)0x0) {
      pcVar3 = (char *)0x0;
    }
    else {
      cfd::core::AbstractTransaction::GetTxid(&local_e0,&this->super_AbstractTransaction);
      cfd::core::Txid::GetHex_abi_cxx11_(&sStack_108,&local_e0);
      pcVar3 = cfd::capi::CreateString(&sStack_108);
      work_txid = pcVar3;
      std::__cxx11::string::~string((string *)&sStack_108);
      cfd::core::Txid::~Txid(&local_e0);
    }
    if (local_b8 == (char **)0x0) {
      pcVar4 = (char *)0x0;
    }
    else {
      cfd::core::AbstractTransaction::GetWitnessHash
                ((ByteData256 *)&local_98,&this->super_AbstractTransaction);
      cfd::core::Txid::Txid(&local_e0,(ByteData256 *)&local_98);
      cfd::core::Txid::GetHex_abi_cxx11_(&sStack_108,&local_e0);
      pcVar4 = cfd::capi::CreateString(&sStack_108);
      work_wtxid = pcVar4;
      std::__cxx11::string::~string((string *)&sStack_108);
      cfd::core::Txid::~Txid(&local_e0);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_98);
    }
    if (local_c0 == (char **)0x0) {
      pcVar5 = (char *)0x0;
    }
    else {
      cfd::core::ConfidentialTransaction::GetWitnessOnlyHash((ByteData256 *)&local_98,this);
      cfd::core::Txid::Txid(&local_e0,(ByteData256 *)&local_98);
      cfd::core::Txid::GetHex_abi_cxx11_(&sStack_108,&local_e0);
      pcVar5 = cfd::capi::CreateString(&sStack_108);
      work_wit_hash = pcVar5;
      std::__cxx11::string::~string((string *)&sStack_108);
      cfd::core::Txid::~Txid(&local_e0);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_98);
    }
    if (size != (uint32_t *)0x0) {
      uVar2 = (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[4])(this);
      *size = uVar2;
    }
    if (vsize != (uint32_t *)0x0) {
      uVar2 = (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[5])(this);
      *vsize = uVar2;
    }
    if (weight != (uint32_t *)0x0) {
      uVar2 = (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[6])(this);
      *weight = uVar2;
    }
    if (version != (uint32_t *)0x0) {
      uVar2 = cfd::core::AbstractTransaction::GetVersion(&this->super_AbstractTransaction);
      *version = uVar2;
    }
    if (locktime != (uint32_t *)0x0) {
      uVar2 = cfd::core::AbstractTransaction::GetLockTime(&this->super_AbstractTransaction);
      *locktime = uVar2;
    }
    if (pcVar3 != (char *)0x0) {
      *txid = pcVar3;
    }
    if (pcVar4 != (char *)0x0) {
      *local_b8 = pcVar4;
    }
    if (pcVar5 != (char *)0x0) {
      *local_c0 = pcVar5;
    }
    cfd::ConfidentialTransactionController::~ConfidentialTransactionController(&ctxc);
    return 0;
  }
  ctxc.super_AbstractTransactionController._vptr_AbstractTransactionController =
       (_func_int **)0x4fbb12;
  ctxc.super_AbstractTransactionController.tx_address_._0_4_ = 0x193;
  ctxc.transaction_.super_AbstractTransaction._vptr_AbstractTransaction =
       (_func_int **)anon_var_dwarf_76e27e;
  cfd::core::logger::warn<>((CfdSourceLocation *)&ctxc,"tx is null or empty.");
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&ctxc,"Failed to parameter. tx is null or empty.",(allocator *)&sStack_108);
  cfd::core::CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)&ctxc);
  __cxa_throw(this_00,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetConfidentialTxInfo(
    void* handle, const char* tx_hex_string, char** txid, char** wtxid,
    char** wit_hash, uint32_t* size, uint32_t* vsize, uint32_t* weight,
    uint32_t* version, uint32_t* locktime) {
  int error_code = CfdErrorCode::kCfdUnknownError;
  char* work_txid = nullptr;
  char* work_wtxid = nullptr;
  char* work_wit_hash = nullptr;
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }

    ConfidentialTransactionController ctxc(tx_hex_string);
    const ConfidentialTransaction& tx = ctxc.GetTransaction();

    if (txid != nullptr) {
      work_txid = CreateString(tx.GetTxid().GetHex());
    }
    if (wtxid != nullptr) {
      work_wtxid = CreateString(Txid(tx.GetWitnessHash()).GetHex());
    }
    if (wit_hash != nullptr) {
      work_wit_hash = CreateString(Txid(tx.GetWitnessOnlyHash()).GetHex());
    }
    if (size != nullptr) {
      *size = tx.GetTotalSize();
    }
    if (vsize != nullptr) {
      *vsize = tx.GetVsize();
    }
    if (weight != nullptr) {
      *weight = tx.GetWeight();
    }
    if (version != nullptr) {
      *version = tx.GetVersion();
    }
    if (locktime != nullptr) {
      *locktime = tx.GetLockTime();
    }

    if (work_txid != nullptr) *txid = work_txid;
    if (work_wtxid != nullptr) *wtxid = work_wtxid;
    if (work_wit_hash != nullptr) *wit_hash = work_wit_hash;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    error_code = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_txid, &work_wtxid, &work_wit_hash);
  return error_code;
}